

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_annotation.cpp
# Opt level: O2

bool __thiscall
ON_OBSOLETE_V2_Annotation::Read(ON_OBSOLETE_V2_Annotation *this,ON_BinaryArchive *file)

{
  double dVar1;
  uint uVar2;
  bool bVar3;
  V5_eAnnotationType VVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double *pdVar8;
  uint ui;
  int major_version;
  int minor_version;
  ON__UINT32 local_1c;
  int local_18 [2];
  
  Destroy(this);
  local_18[0] = 0;
  local_18[1] = 0;
  bVar3 = ON_BinaryArchive::Read3dmChunkVersion(file,local_18,local_18 + 1);
  if ((bVar3) && (local_18[0] == 1)) {
    local_1c = 0;
    bVar3 = ON_BinaryArchive::ReadInt(file,&local_1c);
    if (bVar3) {
      VVar4 = ON_INTERNAL_OBSOLETE::V5AnnotationTypeFromUnsigned(local_1c);
      this->m_type = VVar4;
      bVar3 = ON_BinaryArchive::ReadPlane(file,&this->m_plane);
      if (bVar3) {
        bVar3 = ON_BinaryArchive::ReadArray(file,&this->m_points);
        if (bVar3) {
          bVar3 = ON_BinaryArchive::ReadString(file,&this->m_usertext);
          if (bVar3) {
            bVar3 = ON_BinaryArchive::ReadString(file,&this->m_defaulttext);
            if (bVar3) {
              local_1c = 0;
              bVar3 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_1c);
              if (bVar3) {
                this->m_userpositionedtext = local_1c != 0;
              }
              goto LAB_004caa62;
            }
          }
        }
      }
    }
    bVar3 = false;
  }
LAB_004caa62:
  if ((1e+150 < ABS((this->m_plane).origin.x)) || (1e+150 < ABS((this->m_plane).origin.y))) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    if (ABS((this->m_plane).origin.z) <= 1e+150) {
      uVar2 = (this->m_points).m_count;
      uVar7 = 0;
      if (0 < (int)uVar2) {
        uVar7 = (ulong)uVar2;
      }
      pdVar8 = &((this->m_points).m_a)->y;
      do {
        uVar6 = uVar5;
        if ((uVar7 == uVar6) || (1e+150 < ABS(((ON_2dPoint *)(pdVar8 + -1))->x))) break;
        dVar1 = *pdVar8;
        pdVar8 = pdVar8 + 2;
        uVar5 = uVar6 + 1;
      } while (ABS(dVar1) <= 1e+150);
      uVar5 = (ulong)(byte)(bVar3 & (long)(int)uVar2 <= (long)uVar6);
    }
  }
  return SUB81(uVar5,0);
}

Assistant:

bool ON_OBSOLETE_V2_Annotation::Read( ON_BinaryArchive& file )
{
  Destroy();
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if ( rc && major_version == 1 ) 
  {
    if (rc)
    {
      unsigned int ui = 0;
      rc = file.ReadInt( &ui );
      if (rc)
        m_type = ON_INTERNAL_OBSOLETE::V5AnnotationTypeFromUnsigned(ui);
    }
    if (rc)
      rc = file.ReadPlane( m_plane );
    if (rc)
      rc = file.ReadArray( m_points );
    if (rc)
      rc = file.ReadString( m_usertext );
    if (rc)
      rc = file.ReadString( m_defaulttext );
    if( rc )
    {
      int i = 0;
      rc = file.ReadInt( &i );
      if (rc)
        m_userpositionedtext = (i ? true : false);
    }
  }

  if( fabs( m_plane.origin.x) > REALLY_BIG_NUMBER || fabs( m_plane.origin.y) > REALLY_BIG_NUMBER || fabs( m_plane.origin.z) > REALLY_BIG_NUMBER)
    return false;

  for( int i = 0; i < m_points.Count(); i++)
  {
    if( fabs( m_points[i].x) > REALLY_BIG_NUMBER || fabs( m_points[i].y) > REALLY_BIG_NUMBER)
      return false;
  }


  return rc;
}